

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureGatherTests.cpp
# Opt level: O2

GLvoid __thiscall
gl4cts::anon_unknown_0::GatherBase::CreateTexture2D(GatherBase *this,bool rect,bool base_level)

{
  CallLogWrapper *this_00;
  int internalformat;
  GLenum format;
  undefined7 in_register_00000011;
  uint uVar1;
  GLenum target;
  undefined7 in_register_00000031;
  int i;
  int iVar2;
  size_type __n;
  uint uVar3;
  allocator_type local_95;
  int local_94;
  ulong local_90;
  Vector<float,_4> local_88;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_> pixels;
  ulong uVar4;
  
  iVar2 = (int)CONCAT71(in_register_00000031,rect);
  local_94 = iVar2;
  internalformat = (*(this->super_TGBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x21])()
  ;
  format = (*(this->super_TGBase).super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x22])(this);
  uVar1 = (uint)CONCAT71(in_register_00000011,base_level);
  uVar3 = uVar1 * 0x20 + 0x20;
  uVar4 = (ulong)uVar3;
  target = 0xde1;
  if (iVar2 != 0) {
    target = 0x84f5;
  }
  this_00 = &(this->super_TGBase).super_SubcaseBase.super_GLWrapper.super_CallLogWrapper;
  glu::CallLogWrapper::glGenTextures(this_00,1,&this->tex);
  glu::CallLogWrapper::glBindTexture(this_00,target,this->tex);
  local_90 = uVar4;
  if (local_94 == 0) {
    iVar2 = 0;
    while (uVar3 = (uint)uVar4, uVar3 != 0) {
      glu::CallLogWrapper::glTexImage2D
                (this_00,target,iVar2,internalformat,uVar3,uVar3,0,format,0x1406,(void *)0x0);
      iVar2 = iVar2 + 1;
      uVar4 = (ulong)(uVar3 >> 1);
    }
  }
  else {
    glu::CallLogWrapper::glTexImage2D
              (this_00,0x84f5,0,internalformat,uVar3,uVar3,0,format,0x1406,(void *)0x0);
  }
  __n = 0x400;
  if (base_level) {
    __n = 0x1000;
  }
  tcu::Vector<float,_4>::Vector(&local_88,1.0);
  std::vector<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::vector
            (&pixels,__n,&local_88,&local_95);
  glu::CallLogWrapper::glTexSubImage2D
            (this_00,target,0,0,0,(GLsizei)local_90,(GLsizei)local_90,format,0x1406,
             pixels.
             super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>.
             _M_impl.super__Vector_impl_data._M_start);
  if (format != 0x1902 && (char)local_94 == '\0') {
    glu::CallLogWrapper::glGenerateMipmap(this_00,target);
  }
  local_88.m_data[0] = 0.75;
  local_88.m_data[1] = 0.8125;
  local_88.m_data[2] = 0.875;
  local_88.m_data[3] = 0.9375;
  local_78 = 0x3f1000003f000000;
  uStack_70 = 0x3f3000003f200000;
  local_68 = 0x3d80000000000000;
  uStack_60 = 0x3e4000003e000000;
  local_58 = 0x3ea000003e800000;
  uStack_50 = 0x3ee000003ec00000;
  uVar3 = uVar1 & 0xff;
  glu::CallLogWrapper::glTexSubImage2D(this_00,target,uVar3,0x16,0x19,2,2,format,0x1406,&local_88);
  glu::CallLogWrapper::glTexSubImage2D
            (this_00,target,uVar1 & 0xff,0x10,10,1,1,format,0x1406,&local_88);
  glu::CallLogWrapper::glTexSubImage2D(this_00,target,uVar3,0xb,2,1,1,format,0x1406,&local_78);
  glu::CallLogWrapper::glTexSubImage2D(this_00,target,uVar3,0x18,0xd,1,1,format,0x1406,&local_68);
  glu::CallLogWrapper::glTexSubImage2D(this_00,target,uVar3,9,0xe,1,1,format,0x1406,&local_58);
  glu::CallLogWrapper::glTexParameteri(this_00,target,0x2802,0x812f);
  glu::CallLogWrapper::glTexParameteri(this_00,target,0x2803,0x812f);
  glu::CallLogWrapper::glTexParameteri(this_00,target,0x8072,0x812f);
  if (base_level) {
    glu::CallLogWrapper::glTexParameteri(this_00,target,0x813c,1);
  }
  std::_Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>::~_Vector_base
            (&pixels.
              super__Vector_base<tcu::Vector<float,_4>,_std::allocator<tcu::Vector<float,_4>_>_>);
  return;
}

Assistant:

virtual GLvoid CreateTexture2D(bool rect = false, bool base_level = false)
	{
		GLenum		internal_format = InternalFormat();
		GLenum		format			= Format();
		const GLint csize			= base_level ? 64 : 32;
		GLint		size			= csize;
		GLenum		target			= rect ? GL_TEXTURE_RECTANGLE : GL_TEXTURE_2D;

		glGenTextures(1, &tex);
		glBindTexture(target, tex);
		if (!rect)
		{
			for (int i = 0; size > 0; ++i, size /= 2)
			{
				glTexImage2D(target, i, internal_format, size, size, 0, format, GL_FLOAT, 0);
			}
		}
		else
		{
			glTexImage2D(target, 0, internal_format, size, size, 0, format, GL_FLOAT, 0);
		}
		std::vector<Vec4> pixels(csize * csize, Vec4(1.0));
		glTexSubImage2D(target, 0, 0, 0, csize, csize, format, GL_FLOAT, &pixels[0]);

		if (!rect && format != GL_DEPTH_COMPONENT)
		{
			glGenerateMipmap(target);
		}

		Vec4 data[4] = { Vec4(12. / 16, 13. / 16, 14. / 16, 15. / 16), Vec4(8. / 16, 9. / 16, 10. / 16, 11. / 16),
						 Vec4(0. / 16, 1. / 16, 2. / 16, 3. / 16), Vec4(4. / 16, 5. / 16, 6. / 16, 7. / 16) };

		glTexSubImage2D(target, base_level, 22, 25, 2, 2, format, GL_FLOAT, data);
		glTexSubImage2D(target, base_level, 16, 10, 1, 1, format, GL_FLOAT, data + 0);
		glTexSubImage2D(target, base_level, 11, 2, 1, 1, format, GL_FLOAT, data + 1);
		glTexSubImage2D(target, base_level, 24, 13, 1, 1, format, GL_FLOAT, data + 2);
		glTexSubImage2D(target, base_level, 9, 14, 1, 1, format, GL_FLOAT, data + 3);

		glTexParameteri(target, GL_TEXTURE_WRAP_S, GL_CLAMP_TO_EDGE);
		glTexParameteri(target, GL_TEXTURE_WRAP_T, GL_CLAMP_TO_EDGE);
		glTexParameteri(target, GL_TEXTURE_WRAP_R, GL_CLAMP_TO_EDGE);

		if (base_level)
			glTexParameteri(target, GL_TEXTURE_BASE_LEVEL, 1);
	}